

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

string * __thiscall
flatbuffers::rust::RustGenerator::WrapInNameSpace
          (string *__return_storage_ptr__,RustGenerator *this,Namespace *ns,string *name)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string prefix;
  string sStack_48;
  
  iVar1 = (*(this->super_BaseGenerator)._vptr_BaseGenerator[3])(this);
  if ((Namespace *)CONCAT44(extraout_var,iVar1) == ns) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    iVar1 = (*(this->super_BaseGenerator)._vptr_BaseGenerator[3])(this);
    GetRelativeNamespaceTraversal_abi_cxx11_
              (&sStack_48,this,(Namespace *)CONCAT44(extraout_var_00,iVar1),ns);
    std::operator+(__return_storage_ptr__,&sStack_48,name);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WrapInNameSpace(const Namespace *ns,
                              const std::string &name) const {
    if (CurrentNameSpace() == ns) return name;
    std::string prefix = GetRelativeNamespaceTraversal(CurrentNameSpace(), ns);
    return prefix + name;
  }